

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cc
# Opt level: O1

void __thiscall
phosg::Image::Image(Image *this,size_t x,size_t y,bool has_alpha,uint8_t channel_width)

{
  void *__s;
  undefined7 in_register_00000009;
  size_t __size;
  
  this->width = x;
  this->height = y;
  this->has_alpha = has_alpha;
  this->channel_width = channel_width;
  this->max_value = 0xffffffffffffffff >> (-channel_width & 0x3f);
  __size = y * x * (ulong)(channel_width >> 3) *
                   ((CONCAT71(in_register_00000009,has_alpha) & 0xffffffff) + 3);
  __s = malloc(__size);
  (this->data).raw = __s;
  memset(__s,0,__size);
  return;
}

Assistant:

Image::Image(size_t x, size_t y, bool has_alpha, uint8_t channel_width)
    : width(x),
      height(y),
      has_alpha(has_alpha),
      channel_width(channel_width),
      max_value(mask_for_width(this->channel_width)) {
  size_t num_bytes = this->get_data_size();
  this->data.raw = malloc(num_bytes);
  memset(this->data.raw, 0, num_bytes * sizeof(uint8_t));
}